

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,int rounding_corners)

{
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_98;
  float local_84;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  float local_4c;
  float local_48;
  float r3;
  float r2;
  float r1;
  float r0;
  ImVec2 local_34;
  float local_2c;
  uint local_28;
  float r;
  int rounding_corners_local;
  float rounding_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  local_84 = 0.5;
  if ((rounding_corners & 3U) != 3 && (rounding_corners & 0xcU) != 0xc) {
    local_84 = 1.0;
  }
  local_2c = rounding;
  local_28 = rounding_corners;
  r = rounding;
  _rounding_corners_local = b;
  b_local = a;
  a_local = (ImVec2 *)this;
  local_2c = ImMin(rounding,ABS(b->x - a->x) * local_84 + -1.0);
  local_98 = 0.5;
  if ((local_28 & 9) != 9 && (local_28 & 6) != 6) {
    local_98 = 1.0;
  }
  local_2c = ImMin(local_2c,ABS(_rounding_corners_local->y - b_local->y) * local_98 + -1.0);
  if ((local_2c <= 0.0) || (local_28 == 0)) {
    PathLineTo(this,b_local);
    ImVec2::ImVec2(&local_34,_rounding_corners_local->x,b_local->y);
    PathLineTo(this,&local_34);
    PathLineTo(this,_rounding_corners_local);
    ImVec2::ImVec2((ImVec2 *)&r1,b_local->x,_rounding_corners_local->y);
    PathLineTo(this,(ImVec2 *)&r1);
  }
  else {
    local_a0 = local_2c;
    if ((local_28 & 1) == 0) {
      local_a0 = 0.0;
    }
    r2 = local_a0;
    local_a4 = local_2c;
    if ((local_28 & 2) == 0) {
      local_a4 = 0.0;
    }
    r3 = local_a4;
    local_a8 = local_2c;
    if ((local_28 & 4) == 0) {
      local_a8 = 0.0;
    }
    local_48 = local_a8;
    local_ac = local_2c;
    if ((local_28 & 8) == 0) {
      local_ac = 0.0;
    }
    local_4c = local_ac;
    ImVec2::ImVec2(&local_54,b_local->x + local_a0,b_local->y + local_a0);
    PathArcToFast(this,&local_54,r2,6,9);
    ImVec2::ImVec2(&local_5c,_rounding_corners_local->x - r3,b_local->y + r3);
    PathArcToFast(this,&local_5c,r3,9,0xc);
    ImVec2::ImVec2(&local_64,_rounding_corners_local->x - local_48,
                   _rounding_corners_local->y - local_48);
    PathArcToFast(this,&local_64,local_48,0,3);
    ImVec2::ImVec2(&local_6c,b_local->x + local_4c,_rounding_corners_local->y - local_4c);
    PathArcToFast(this,&local_6c,local_4c,3,6);
  }
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, int rounding_corners)
{
    float r = rounding;
    r = ImMin(r, fabsf(b.x-a.x) * ( ((rounding_corners&(1|2))==(1|2)) || ((rounding_corners&(4|8))==(4|8)) ? 0.5f : 1.0f ) - 1.0f);
    r = ImMin(r, fabsf(b.y-a.y) * ( ((rounding_corners&(1|8))==(1|8)) || ((rounding_corners&(2|4))==(2|4)) ? 0.5f : 1.0f ) - 1.0f);

    if (r <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x,a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x,b.y));
    }
    else
    {
        const float r0 = (rounding_corners & 1) ? r : 0.0f;
        const float r1 = (rounding_corners & 2) ? r : 0.0f;
        const float r2 = (rounding_corners & 4) ? r : 0.0f;
        const float r3 = (rounding_corners & 8) ? r : 0.0f;
        PathArcToFast(ImVec2(a.x+r0,a.y+r0), r0, 6, 9);
        PathArcToFast(ImVec2(b.x-r1,a.y+r1), r1, 9, 12);
        PathArcToFast(ImVec2(b.x-r2,b.y-r2), r2, 0, 3);
        PathArcToFast(ImVec2(a.x+r3,b.y-r3), r3, 3, 6);
    }
}